

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_size_test.cc
# Opt level: O2

void test_insertion<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<MemoryMapping,boost::intrusive::tree_node_traits<void*>,(boost::intrusive::link_mode_type)1,boost::intrusive::dft_tag,6u>,false>>
               (MemoryContainer<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<MemoryMapping,_boost::intrusive::tree_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_boost::intrusive::dft_tag,_6U>,_false>_>
                *c,vector<MemoryMapping,_std::allocator<MemoryMapping>_> *values,size_t numRepeat)

{
  int iVar1;
  long lVar2;
  time_duration_type tVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  long lVar5;
  size_t repeat;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ptime tend;
  ptime tini;
  vector<double,_std::allocator<double>_> times;
  double local_90;
  double local_88;
  double local_80;
  ptime local_78;
  ptime local_70;
  _Vector_base<double,_std::allocator<double>_> local_68;
  double local_50;
  double local_48;
  double dStack_40;
  
  boost::posix_time::ptime::ptime(&local_70);
  boost::posix_time::ptime::ptime(&local_78);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  for (sVar6 = 0; sVar6 != numRepeat; sVar6 = sVar6 + 1) {
    (*c->_vptr_MemoryContainer[3])(c);
    local_70 = boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time();
    lVar2 = ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                  _M_impl.super__Vector_impl_data._M_start) / 0x88;
    lVar5 = 0;
    while (bVar8 = lVar2 != 0, lVar2 = lVar2 + -1, bVar8) {
      (**c->_vptr_MemoryContainer)
                (c,(long)&(((values->
                            super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                            _M_impl.super__Vector_impl_data._M_start)->
                          super_set_base_hook<boost::intrusive::optimize_size<false>_>).super_type.
                          super_type.super_rbtree_node<void_*>.parent_ + lVar5);
      lVar5 = lVar5 + 0x88;
    }
    local_78 = boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time();
    tVar3 = boost::date_time::
            counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
            ::subtract_times((time_rep_type *)&local_78,(time_rep_type *)&local_70);
    lVar2 = ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                  _M_impl.super__Vector_impl_data._M_start) / 0x88;
    auVar9._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar9._0_8_ = lVar2;
    auVar9._12_4_ = 0x45300000;
    local_80 = (double)((long)tVar3.
                              super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                              .ticks_.value_ * 1000) /
               ((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&local_68,&local_80);
    iVar1 = (*c->_vptr_MemoryContainer[4])(c);
    if (CONCAT44(extraout_var,iVar1) !=
        ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>)._M_impl.
              super__Vector_impl_data._M_start) / 0x88) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"    ERROR: size not consistent");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  local_88 = 0.0;
  while (local_68._M_impl.super__Vector_impl_data._M_finish !=
         local_68._M_impl.super__Vector_impl_data._M_start) {
    local_88 = local_88 + local_68._M_impl.super__Vector_impl_data._M_finish[-1];
    local_68._M_impl.super__Vector_impl_data._M_finish =
         local_68._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  std::operator<<((ostream *)&std::cout,",");
  dStack_40 = (double)CONCAT44(0x45300000,(int)(numRepeat >> 0x20)) - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)numRepeat) - 4503599627370496.0);
  std::ostream::_M_insert<double>(local_88 / local_48);
  for (sVar6 = 0; sVar6 != numRepeat; sVar6 = sVar6 + 1) {
    local_70 = boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time();
    lVar2 = ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                  _M_impl.super__Vector_impl_data._M_start) / 0x88;
    lVar7 = 0;
    lVar5 = 0;
    while (bVar8 = lVar2 != 0, lVar2 = lVar2 + -1, bVar8) {
      (*c->_vptr_MemoryContainer[1])(&local_80,c);
      (*c->_vptr_MemoryContainer[2])
                (&local_50,c,
                 (long)&(((values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>
                          )._M_impl.super__Vector_impl_data._M_start)->
                        super_set_base_hook<boost::intrusive::optimize_size<false>_>).super_type.
                        super_type.super_rbtree_node<void_*>.parent_ + lVar7);
      lVar5 = lVar5 + (ulong)(local_80 != local_50);
      lVar7 = lVar7 + 0x88;
    }
    local_78 = boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time();
    tVar3 = boost::date_time::
            counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
            ::subtract_times((time_rep_type *)&local_78,(time_rep_type *)&local_70);
    lVar2 = ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                  _M_impl.super__Vector_impl_data._M_start) / 0x88;
    auVar10._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar10._0_8_ = lVar2;
    auVar10._12_4_ = 0x45300000;
    local_80 = (double)((long)tVar3.
                              super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                              .ticks_.value_ * 1000) /
               ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&local_68,&local_80);
    if (lVar5 != ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                       _M_impl.super__Vector_impl_data._M_start) / 0x88) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"    ERROR: not all found, ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," found out of ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  local_90 = 0.0;
  while (local_68._M_impl.super__Vector_impl_data._M_finish !=
         local_68._M_impl.super__Vector_impl_data._M_start) {
    local_90 = local_90 + local_68._M_impl.super__Vector_impl_data._M_finish[-1];
    local_68._M_impl.super__Vector_impl_data._M_finish =
         local_68._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  std::operator<<((ostream *)&std::cout,",");
  std::ostream::_M_insert<double>(local_90 / local_48);
  (*c->_vptr_MemoryContainer[3])(c);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void test_insertion(MemoryContainer<Iterator> &c,
                    std::vector<MemoryMapping> &values,
                    std::size_t numRepeat) {
  ptime tini, tend;
  std::vector<double> times;
  // Insert
  {
    for( std::size_t repeat = 0, repeat_max = numRepeat
           ; repeat != repeat_max
           ; ++repeat){
      c.clear();
      tini = microsec_clock::universal_time();
      for( std::size_t i = 0, max = values.size()
             ; i != max
             ; ++i){
        c.insert(values[i]);
      }
      tend = microsec_clock::universal_time();
      times.push_back(double((tend-tini).total_nanoseconds())
                      /double(values.size()));
      //std::cout << "," << times.back();
      if(c.size() != values.size()){
        std::cerr << "    ERROR: size not consistent" << std::endl;
      }
    }
    double total = 0.0;
    while(!times.empty()) {
      total += times.back();
      times.pop_back();
    }
    std::cout << "," << total/numRepeat;
  }
  // Search
  {
    for( std::size_t repeat = 0, repeat_max = numRepeat
           ; repeat != repeat_max
           ; ++repeat){
      std::size_t found = 0;
      tini = microsec_clock::universal_time();
      for( std::size_t i = 0, max = values.size()
             ; i != max
             ; ++i){
        found += static_cast<std::size_t>(c.end() != c.find(values[i]));
      }
      tend = microsec_clock::universal_time();
      times.push_back(double((tend-tini).total_nanoseconds())/
                      double(values.size()));
      //std::cout << "," << times.back();
      if(found != values.size()){
        std::cerr << "    ERROR: not all found, "
                  << found << " found out of " << values.size()
                  << std::endl;
      }
    }
    double total = 0.0;
    while(!times.empty()) {
      total += times.back();
      times.pop_back();
    }
    std::cout << "," << total/numRepeat;
  }
  c.clear();
}